

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_scopes.cpp
# Opt level: O0

spv_result_t spvtools::val::ValidateScope(ValidationState_t *_,Instruction *inst,uint32_t scope)

{
  Instruction *this;
  bool bVar1;
  Op opcode_00;
  int32_t iVar2;
  DiagnosticStream *pDVar3;
  Instruction *inst_00;
  string local_7d8;
  DiagnosticStream local_7b8;
  DiagnosticStream local_5e0;
  DiagnosticStream local_408;
  char *local_230;
  DiagnosticStream local_228;
  tuple<bool_&,_bool_&,_unsigned_int_&> local_50;
  tuple<bool,_bool,_unsigned_int> local_38;
  uint local_30;
  bool local_2a;
  bool local_29;
  uint32_t value;
  bool is_const_int32;
  uint32_t uStack_24;
  bool is_int32;
  Op opcode;
  uint32_t scope_local;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  uStack_24 = scope;
  _opcode = inst;
  inst_local = (Instruction *)_;
  value = Instruction::opcode(inst);
  local_29 = false;
  local_2a = false;
  local_30 = 0;
  ValidationState_t::EvalInt32IfConst(&local_38,(ValidationState_t *)inst_local,uStack_24);
  std::tie<bool,bool,unsigned_int>(&local_50,&local_29,&local_2a,&local_30);
  std::tuple<bool&,bool&,unsigned_int&>::operator=
            ((tuple<bool&,bool&,unsigned_int&> *)&local_50,&local_38);
  if ((local_29 & 1U) == 0) {
    ValidationState_t::diag
              (&local_228,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,_opcode);
    local_230 = spvOpcodeString(value);
    pDVar3 = DiagnosticStream::operator<<(&local_228,&local_230);
    pDVar3 = DiagnosticStream::operator<<
                       (pDVar3,(char (*) [36])": expected scope to be a 32-bit int");
    __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar3);
    DiagnosticStream::~DiagnosticStream(&local_228);
  }
  else {
    if ((local_2a & 1U) == 0) {
      bVar1 = ValidationState_t::HasCapability((ValidationState_t *)inst_local,Shader);
      if ((bVar1) &&
         (bVar1 = ValidationState_t::HasCapability
                            ((ValidationState_t *)inst_local,CooperativeMatrixNV), !bVar1)) {
        ValidationState_t::diag
                  (&local_408,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,_opcode);
        pDVar3 = DiagnosticStream::operator<<
                           (&local_408,
                            (char (*) [56])"Scope ids must be OpConstant when Shader capability is "
                           );
        pDVar3 = DiagnosticStream::operator<<(pDVar3,(char (*) [8])0x631bda);
        __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar3);
        DiagnosticStream::~DiagnosticStream(&local_408);
        return __local._4_4_;
      }
      bVar1 = ValidationState_t::HasCapability((ValidationState_t *)inst_local,Shader);
      if ((bVar1) &&
         (bVar1 = ValidationState_t::HasCapability
                            ((ValidationState_t *)inst_local,CooperativeMatrixNV), bVar1)) {
        opcode_00 = ValidationState_t::GetIdOpcode((ValidationState_t *)inst_local,uStack_24);
        iVar2 = spvOpcodeIsConstant(opcode_00);
        if (iVar2 == 0) {
          ValidationState_t::diag
                    (&local_5e0,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,_opcode);
          pDVar3 = DiagnosticStream::operator<<
                             (&local_5e0,
                              (char (*) [60])
                              "Scope ids must be constant or specialization constant when ");
          pDVar3 = DiagnosticStream::operator<<(pDVar3,(char (*) [42])0x631bb8);
          __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar3);
          DiagnosticStream::~DiagnosticStream(&local_5e0);
          return __local._4_4_;
        }
      }
    }
    if (((local_2a & 1U) == 0) || (bVar1 = IsValidScope(local_30), bVar1)) {
      __local._4_4_ = SPV_SUCCESS;
    }
    else {
      ValidationState_t::diag
                (&local_7b8,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,_opcode);
      pDVar3 = DiagnosticStream::operator<<(&local_7b8,(char (*) [23])"Invalid scope value:\n ");
      this = inst_local;
      inst_00 = ValidationState_t::FindDef((ValidationState_t *)inst_local,uStack_24);
      ValidationState_t::Disassemble_abi_cxx11_(&local_7d8,(ValidationState_t *)this,inst_00);
      pDVar3 = DiagnosticStream::operator<<(pDVar3,&local_7d8);
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar3);
      std::__cxx11::string::~string((string *)&local_7d8);
      DiagnosticStream::~DiagnosticStream(&local_7b8);
    }
  }
  return __local._4_4_;
}

Assistant:

spv_result_t ValidateScope(ValidationState_t& _, const Instruction* inst,
                           uint32_t scope) {
  spv::Op opcode = inst->opcode();
  bool is_int32 = false, is_const_int32 = false;
  uint32_t value = 0;
  std::tie(is_int32, is_const_int32, value) = _.EvalInt32IfConst(scope);

  if (!is_int32) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << spvOpcodeString(opcode) << ": expected scope to be a 32-bit int";
  }

  if (!is_const_int32) {
    if (_.HasCapability(spv::Capability::Shader) &&
        !_.HasCapability(spv::Capability::CooperativeMatrixNV)) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Scope ids must be OpConstant when Shader capability is "
             << "present";
    }
    if (_.HasCapability(spv::Capability::Shader) &&
        _.HasCapability(spv::Capability::CooperativeMatrixNV) &&
        !spvOpcodeIsConstant(_.GetIdOpcode(scope))) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Scope ids must be constant or specialization constant when "
             << "CooperativeMatrixNV capability is present";
    }
  }

  if (is_const_int32 && !IsValidScope(value)) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Invalid scope value:\n " << _.Disassemble(*_.FindDef(scope));
  }

  return SPV_SUCCESS;
}